

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>::
operator<(result *__return_storage_ptr__,
         expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&> *this
         ,char (*rhs) [6])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest *this_00;
  void *__s1;
  ulong uVar2;
  size_type sVar3;
  result *prVar4;
  int iVar5;
  size_t sVar6;
  size_t __n;
  char *pcVar7;
  char (*in_R8) [6];
  char *local_e0;
  size_type local_d8;
  char local_d0 [8];
  undefined8 uStack_c8;
  string local_c0;
  result *local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  char local_88 [8];
  undefined8 uStack_80;
  char *local_78;
  size_type local_70;
  char local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  bool local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this_00 = *(lest **)this;
  __s1 = *(void **)this_00;
  uVar2 = *(ulong *)(this_00 + 8);
  local_a0 = __return_storage_ptr__;
  sVar6 = strlen(*rhs);
  __n = sVar6;
  if (uVar2 < sVar6) {
    __n = uVar2;
  }
  iVar5 = memcmp(__s1,rhs,__n);
  if ((iVar5 == 0) && (iVar5 = 0, uVar2 != sVar6)) {
    iVar5 = -(uint)(uVar2 < sVar6);
  }
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"<","");
  local_98.data_ = local_88;
  if (local_e0 == local_d0) {
    uStack_80 = uStack_c8;
  }
  else {
    local_98.data_ = local_e0;
  }
  local_98.size_ = local_d8;
  local_d8 = 0;
  local_d0[0] = '\0';
  local_e0 = local_d0;
  to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&local_c0,this_00,&local_98,(string *)rhs,in_R8);
  sVar3 = local_c0._M_string_length;
  paVar1 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == paVar1) {
    uStack_60 = local_c0.field_2._8_4_;
    uStack_5c = local_c0.field_2._12_4_;
    local_c0._M_dataplus._M_p = local_68;
  }
  local_70 = local_c0._M_string_length;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_allocated_capacity._0_4_ =
       local_c0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_58 = SUB41((uint)iVar5 >> 0x1f,0);
  pcVar7 = local_c0._M_dataplus._M_p + sVar3;
  local_78 = local_c0._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,pcVar7);
  prVar4 = local_a0;
  local_a0->passed = local_58;
  (local_a0->decomposition)._M_dataplus._M_p = (pointer)&(local_a0->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0->decomposition,local_50,local_50 + local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_98.data_ != local_88) {
    operator_delete(local_98.data_);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  return prVar4;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }